

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O1

void __thiscall
Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0>::
set_video_address(ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0> *this)

{
  atomic_flag *paVar1;
  __atomic_flag_data_type _Var2;
  HalfCycles duration;
  uint8_t uVar3;
  unique_ptr<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  local_18;
  
  LOCK();
  paVar1 = &(this->video_).flush_concurrency_check_;
  _Var2 = (paVar1->super___atomic_flag_base)._M_i;
  (paVar1->super___atomic_flag_base)._M_i = true;
  UNLOCK();
  if (_Var2 == false) {
    if ((this->video_).is_flushed_ == false) {
      (this->video_).is_flushed_ = true;
      (this->video_).did_flush_ = true;
      duration.super_WrappedInt<HalfCycles>.length_ =
           (WrappedInt<HalfCycles>)
           (this->video_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
      (this->video_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
      ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>::run_for
                (&(this->video_).object_,duration);
    }
    LOCK();
    (this->video_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
    UNLOCK();
    local_18._M_t.
    super___uniq_ptr_impl<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>_*,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    .
    super__Tuple_impl<1UL,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    .
    super__Head_base<1UL,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
    ._M_head_impl.actor_ =
         (_Head_base<1UL,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
          )&this->video_;
    local_18._M_t.
    super___uniq_ptr_impl<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>_*,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    .
    super__Head_base<0UL,_Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>_*,_false>
    ._M_head_impl = &(this->video_).object_;
    (this->video_).object_.memory_ =
         (this->ram_)._M_elems + (ulong)((this->port7ffd_ & 8) >> 3) * 0x8000 + 0x14000;
    std::
    unique_ptr<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr(&local_18);
    uVar3 = ((this->port7ffd_ & 8) >> 3) * '\x02' + '\x05';
    (this->banks_)._M_elems[0].is_video = uVar3 == (this->banks_)._M_elems[0].page;
    (this->banks_)._M_elems[1].is_video = uVar3 == (this->banks_)._M_elems[1].page;
    (this->banks_)._M_elems[2].is_video = uVar3 == (this->banks_)._M_elems[2].page;
    (this->banks_)._M_elems[3].is_video = uVar3 == (this->banks_)._M_elems[3].page;
    return;
  }
  __assert_fail("!flush_concurrency_check_.test_and_set()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Sinclair/ZXSpectrum/../../../ClockReceiver/JustInTime.hpp"
                ,0x7e,
                "auto JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<Sinclair::ZXSpectrum::Video::Timing::FortyEightK>>::operator->() [T = Sinclair::ZXSpectrum::Video::Video<Sinclair::ZXSpectrum::Video::Timing::FortyEightK>, LocalTimeScale = HalfCycles, multiplier = 1, divider = 1]"
               );
}

Assistant:

void set_video_address() {
			video_->set_video_source(&ram_[((port7ffd_ & 0x08) ? 7 : 5) * 16384]);
			update_video_base();
		}